

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void __thiscall testing::internal::ExpectationBase::RetireAllPreRequisites(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  ExpectationBase **ppEVar2;
  _Base_ptr p_Var3;
  ExpectationBase *__tmp;
  vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
  expectations;
  ExpectationBase *next;
  ExpectationBase **local_40;
  ExpectationBase **local_38;
  ExpectationBase **local_30;
  ExpectationBase *local_28;
  
  if (this->retired_ == false) {
    ppEVar2 = (ExpectationBase **)operator_new(8);
    local_38 = ppEVar2 + 1;
    *ppEVar2 = this;
    local_40 = ppEVar2;
    local_30 = local_38;
    do {
      pEVar1 = local_38[-1];
      local_38 = local_38 + -1;
      p_Var3 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_left;
      while ((_Rb_tree_header *)p_Var3 !=
             &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header) {
        local_28 = *(ExpectationBase **)(p_Var3 + 1);
        if (local_28->retired_ == false) {
          local_28->retired_ = true;
          if (local_38 == local_30) {
            std::
            vector<testing::internal::ExpectationBase*,std::allocator<testing::internal::ExpectationBase*>>
            ::_M_realloc_insert<testing::internal::ExpectationBase*const&>
                      ((vector<testing::internal::ExpectationBase*,std::allocator<testing::internal::ExpectationBase*>>
                        *)&local_40,(iterator)local_38,&local_28);
          }
          else {
            *local_38 = local_28;
            local_38 = local_38 + 1;
          }
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        ppEVar2 = local_40;
      }
    } while (ppEVar2 != local_38);
    if (ppEVar2 != (ExpectationBase **)0x0) {
      operator_delete(ppEVar2,(long)local_30 - (long)ppEVar2);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  if (is_retired()) {
    // We can take this short-cut as we never retire an expectation
    // until we have retired all its pre-requisites.
    return;
  }

  ::std::vector<ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      ExpectationBase* next = it->expectation_base().get();
      if (!next->is_retired()) {
        next->Retire();
        expectations.push_back(next);
      }
    }
  }
}